

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorRasterizerTests.cpp
# Opt level: O1

void __thiscall
agge::tests::VectorRasterizerTests::InterCellIndividualHLineIsRepresentedBySparsedCells
          (VectorRasterizerTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cell reference2 [3];
  cell reference1 [3];
  vector_rasterizer vr;
  string local_120;
  LocationInfo local_100;
  undefined1 local_d8 [8];
  undefined1 auStack_d0 [8];
  undefined1 auStack_c8 [16];
  undefined1 local_b8 [8];
  undefined1 auStack_b0 [8];
  undefined1 auStack_a8 [24];
  vector_rasterizer local_90;
  
  vector_rasterizer::vector_rasterizer(&local_90);
  vector_rasterizer::line(&local_90,0,0,0x5ff,3);
  auStack_a8._0_6_ = 0x500010000;
  auStack_a8._6_2_ = 0;
  auStack_a8._8_4_ = 0xff;
  auStack_a8._12_2_ = 1;
  local_b8._0_2_ = 1;
  local_b8._2_2_ = 0;
  local_b8._4_4_ = 0x100;
  auStack_b0._0_2_ = 1;
  auStack_b0._2_2_ = 3;
  auStack_b0._4_2_ = 0;
  auStack_b0._6_2_ = 0x100;
  paVar1 = &local_120.field_2;
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_120,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_100,&local_120,0x2e3);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,3ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [3])local_b8,&local_90._cells,&local_100);
  paVar2 = &local_100.filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_100.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  vector_rasterizer::reset(&local_90);
  vector_rasterizer::line(&local_90,-0x100,0x100,0xaff,0x103);
  auStack_c8._0_6_ = 0xa00010000;
  auStack_c8._6_2_ = 1;
  auStack_c8._8_4_ = 0xff;
  auStack_c8._12_2_ = 1;
  local_d8._0_2_ = 2;
  local_d8._2_2_ = 1;
  local_d8._4_4_ = 0x100;
  auStack_d0._0_2_ = 1;
  auStack_d0._2_2_ = 6;
  auStack_d0._4_2_ = 1;
  auStack_d0._6_2_ = 0x100;
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_120,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_100,&local_120,0x2f2);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,3ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [3])local_d8,&local_90._cells,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_100.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if (local_90._x_sorted_cells._begin != (cell *)0x0) {
    operator_delete__(local_90._x_sorted_cells._begin);
  }
  if (local_90._histogram_x._begin != (uint *)0x0) {
    operator_delete__(local_90._histogram_x._begin);
  }
  if (local_90._histogram_y._begin != (uint *)0x0) {
    operator_delete__(local_90._histogram_y._begin);
  }
  if (local_90._cells._begin != (cell *)0x0) {
    operator_delete__(local_90._cells._begin);
  }
  return;
}

Assistant:

test( InterCellIndividualHLineIsRepresentedBySparsedCells )
			{
				// INIT
				vector_rasterizer vr;

				// ACT
				vr.line(0, 0, 1535, 3); // dx = 6 * 256 - 1 (to compensate floating point rounding)

				// ASSERT
				const vector_rasterizer::cell reference1[] = {
					{ 1, 0, 256, 1 },
					{ 3, 0, 256, 1 },
					{ 5, 0, 255, 1 },
				};

				assert_equal(reference1, vr.cells());

				// INIT
				vr.reset();

				// ACT
				vr.line(-256, 256, 2815, 259); // dx = 12 * 256 - 1 (to compensate floating point rounding)

				// ASSERT
				const vector_rasterizer::cell reference2[] = {
					{ 2, 1, 256, 1 },
					{ 6, 1, 256, 1 },
					{ 10, 1, 255, 1 },
				};

				assert_equal(reference2, vr.cells());
			}